

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Preferences.cxx
# Opt level: O2

void __thiscall Fl_Preferences::Node::Node(Node *this,char *path)

{
  char *pcVar1;
  
  if (path == (char *)0x0) {
    pcVar1 = (char *)0x0;
  }
  else {
    pcVar1 = strdup(path);
  }
  this->path_ = pcVar1;
  this->child_ = (Node *)0x0;
  this->next_ = (Node *)0x0;
  (this->field_2).parent_ = (Node *)0x0;
  this->entry_ = (Entry *)0x0;
  this->nEntry_ = 0;
  this->NEntry_ = 0;
  this->field_0x30 = this->field_0x30 & 0xf8;
  this->index_ = (Node **)0x0;
  this->nIndex_ = 0;
  this->NIndex_ = 0;
  return;
}

Assistant:

Fl_Preferences::Node::Node( const char *path ) {
  if ( path ) path_ = strdup( path ); else path_ = 0;
  child_ = 0; next_ = 0; parent_ = 0;
  entry_ = 0;
  nEntry_ = NEntry_ = 0;
  dirty_ = 0;
  top_ = 0;
  indexed_ = 0;
  index_ = 0;
  nIndex_ = NIndex_ = 0;
}